

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
ElementsTransactionApi_EstimateFee_MinimumValue_Test::TestBody
          (ElementsTransactionApi_EstimateFee_MinimumValue_Test *this)

{
  initializer_list<cfd::api::ElementsUtxoAndOption> __l;
  initializer_list<cfd::UtxoData> __l_00;
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  char *pcVar4;
  size_type sVar5;
  char *pcVar6;
  size_t sVar7;
  Amount AVar8;
  AssertionResult gtest_ar_6;
  uint32_t minimum_fee;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  ByteData tx;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_3;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  txouts;
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ct_addrs;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  ElementsTransactionApi api;
  Amount tx_fee;
  Amount utxo_fee;
  Amount calc_fee;
  uint64_t effective_fee_rate2;
  double effective_fee_rate;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  ConfidentialTransactionContext txc;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  utxos_and_options;
  ElementsUtxoAndOption eutxo1;
  UtxoData utxo1;
  string tx_hex;
  ElementsAddressFactory factory;
  UtxoData *in_stack_ffffffffffffdf78;
  undefined4 uVar9;
  ConfidentialTxOutReference *this_00;
  ElementsUtxoAndOption *in_stack_ffffffffffffdf80;
  uint uVar10;
  ElementsUtxoAndOption *this_01;
  undefined4 in_stack_ffffffffffffdf88;
  undefined4 uVar11;
  undefined4 in_stack_ffffffffffffdf8c;
  ElementsUtxoAndOption *in_stack_ffffffffffffdf90;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *this_02;
  ElementsUtxoAndOption *in_stack_ffffffffffffdf98;
  undefined4 in_stack_ffffffffffffdfa0;
  undefined4 in_stack_ffffffffffffdfa4;
  string *in_stack_ffffffffffffdfa8;
  undefined4 in_stack_ffffffffffffdfb0;
  undefined4 in_stack_ffffffffffffdfb4;
  undefined4 in_stack_ffffffffffffdfb8;
  NetType in_stack_ffffffffffffdfbc;
  ElementsAddressFactory *in_stack_ffffffffffffdfc0;
  undefined1 in_stack_ffffffffffffdfcf;
  Amount *in_stack_ffffffffffffdfd0;
  Amount *in_stack_ffffffffffffdfd8;
  ConfidentialAssetId *in_stack_ffffffffffffdfe0;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  *in_stack_ffffffffffffdfe8;
  undefined4 in_stack_ffffffffffffdff0;
  undefined1 in_stack_ffffffffffffdff4;
  undefined1 in_stack_ffffffffffffdff5;
  undefined1 in_stack_ffffffffffffdff6;
  undefined1 in_stack_ffffffffffffdff7;
  UtxoData *in_stack_ffffffffffffdff8;
  allocator *paVar12;
  UtxoData *in_stack_ffffffffffffe000;
  int iVar13;
  undefined8 in_stack_ffffffffffffe038;
  int in_stack_ffffffffffffe040;
  uint32_t *in_stack_ffffffffffffe048;
  ByteData *local_1f20;
  undefined8 **local_1f00;
  AssertHelper local_1eb0;
  Message local_1ea8;
  undefined4 local_1e9c;
  AssertionResult local_1e98;
  uint local_1e84;
  AssertHelper local_1e80;
  Message local_1e78;
  undefined4 local_1e70;
  uint32_t local_1e6c;
  AssertionResult local_1e68;
  AssertHelper local_1e58;
  Message local_1e50;
  undefined4 local_1e44;
  size_t local_1e40;
  AssertionResult local_1e38;
  AssertHelper local_1e28;
  Message local_1e20;
  ByteData local_1e18;
  AssertHelper local_1e00;
  Message local_1df8;
  OutPoint local_1df0;
  AssertHelper local_1dc8;
  Message local_1dc0;
  SigHashType local_1db8;
  allocator local_1da9;
  string local_1da8;
  Privkey local_1d88;
  allocator local_1d61;
  string local_1d60;
  Pubkey local_1d40;
  OutPoint local_1d28;
  ByteData local_1d00;
  string local_1ce8;
  AssertHelper local_1cc8;
  Message local_1cc0;
  ConfidentialValue local_1cb8;
  byte local_1c89;
  AssertionResult local_1c88;
  string local_1c78;
  AssertHelper local_1c58;
  Message local_1c50;
  ConfidentialValue local_1c48;
  undefined1 local_1c19;
  AssertionResult local_1c18;
  AssertHelper local_1c08;
  Message local_1c00;
  undefined4 local_1bf4;
  size_type local_1bf0;
  AssertionResult local_1be8;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  local_1bd8;
  AssertHelper local_1bc0;
  Message local_1bb8 [4];
  AssertHelper local_1b98;
  Message local_1b90;
  undefined4 local_1b84;
  int64_t local_1b80;
  AssertionResult local_1b78;
  AssertHelper local_1b68;
  Message local_1b60;
  undefined4 local_1b54;
  int64_t local_1b50;
  AssertionResult local_1b48;
  AssertHelper local_1b38;
  Message local_1b30;
  undefined4 local_1b24;
  int64_t local_1b20;
  AssertionResult local_1b18;
  ConfidentialTransactionContext *local_1b08;
  undefined1 local_1b00;
  string local_1af8;
  ConfidentialTransactionContext *local_1ad8;
  undefined1 local_1ad0;
  ElementsTransactionApi local_1ac1;
  Amount local_1ac0;
  char local_1ab0 [8];
  undefined7 in_stack_ffffffffffffe558;
  undefined1 in_stack_ffffffffffffe55f;
  ConfidentialTransactionContext *this_03;
  undefined7 in_stack_ffffffffffffe569;
  Pubkey *pubkey;
  OutPoint *outpoint;
  AssertHelper in_stack_ffffffffffffe580;
  Message local_1a78;
  ByteData256 *in_stack_ffffffffffffe590;
  ByteData *annex;
  ByteData local_1a60 [7];
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffe658;
  ConfidentialTransactionContext *in_stack_ffffffffffffe660;
  ByteData local_1538;
  ConfidentialTransaction local_1510 [3];
  undefined1 **local_1430;
  undefined8 *local_1428 [174];
  undefined1 **local_eb8;
  undefined8 local_eb0;
  allocator local_919;
  string local_918;
  ConfidentialValue local_8f8;
  allocator local_8c9;
  string local_8c8;
  BlindFactor local_8a8;
  allocator local_881;
  string local_880;
  BlindFactor local_860;
  allocator local_839;
  string local_838;
  ConfidentialAssetId local_818;
  Amount local_7f0;
  allocator local_7d9;
  string local_7d8 [32];
  Address local_7b8;
  allocator local_631;
  string local_630;
  Script local_610;
  allocator local_5d1;
  string local_5d0;
  Txid local_5b0;
  undefined8 local_590;
  Txid local_568;
  uint32_t local_548;
  Script local_540 [2];
  Address local_4d0;
  string local_350 [32];
  int64_t local_330;
  undefined1 local_328;
  undefined4 local_320;
  undefined8 local_318;
  ConfidentialAssetId local_310 [12];
  BlindFactor local_130;
  BlindFactor local_110;
  ConfidentialValue local_f0 [3];
  allocator local_51;
  string local_50 [80];
  
  cfd::ElementsAddressFactory::ElementsAddressFactory
            (in_stack_ffffffffffffdfc0,in_stack_ffffffffffffdfbc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_50,
             "02000000000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0000000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000005f5e100036a2e218bb512a3e65c80b59fec57aee428b7512276bcfa366c154dd7262994c817a914363273e2f851bda01e24cda41ba748b8d1f54cfe870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000000c8000000000000"
             ,&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  cfd::UtxoData::UtxoData
            ((UtxoData *)
             CONCAT17(in_stack_ffffffffffffdff7,
                      CONCAT16(in_stack_ffffffffffffdff6,
                               CONCAT15(in_stack_ffffffffffffdff5,
                                        CONCAT14(in_stack_ffffffffffffdff4,in_stack_ffffffffffffdff0
                                                )))));
  local_590 = 0;
  local_318 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5d0,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,&local_5d1);
  cfd::core::Txid::Txid(&local_5b0,&local_5d0);
  cfd::core::Txid::operator=(&local_568,&local_5b0);
  cfd::core::Txid::~Txid((Txid *)0x2cc856);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
  local_548 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_630,"0014eb3c0d55b7098a4aef4a18ee1eebcb1ed924a82b",&local_631);
  cfd::core::Script::Script(&local_610,&local_630);
  cfd::core::Script::operator=(local_540,&local_610);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffdf80);
  std::__cxx11::string::~string((string *)&local_630);
  std::allocator<char>::~allocator((allocator<char> *)&local_631);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7d8,"ert1qav7q64dhpx9y4m62rrhpa67trmvjf2ptxfddld",&local_7d9);
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffdf8c,in_stack_ffffffffffffdf88),
             (string *)in_stack_ffffffffffffdf80);
  cfd::core::Address::operator=(&local_4d0,&local_7b8);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffdf80);
  std::__cxx11::string::~string(local_7d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7d9);
  std::__cxx11::string::operator=
            (local_350,"wpkh(03f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d6)");
  cfd::core::Amount::Amount(&local_7f0,0x5f5e1c8);
  local_328 = local_7f0.ignore_check_;
  local_330 = local_7f0.amount_;
  local_320 = 4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_838,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,&local_839);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_818,&local_838);
  cfd::core::ConfidentialAssetId::operator=(local_310,&local_818);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x2cca54);
  std::__cxx11::string::~string((string *)&local_838);
  std::allocator<char>::~allocator((allocator<char> *)&local_839);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_880,"ebfecaae1665f32a3843ce65c42fb6e3f51136fa9d37274b810887923ae89339"
             ,&local_881);
  cfd::core::BlindFactor::BlindFactor(&local_860,&local_880);
  cfd::core::BlindFactor::operator=(&local_130,&local_860);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x2ccadc);
  std::__cxx11::string::~string((string *)&local_880);
  std::allocator<char>::~allocator((allocator<char> *)&local_881);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_8c8,"80af7bd339db43ad22c1fa9109eea6d617c8b87b91c4bde2b5fafcbb1902211a"
             ,&local_8c9);
  cfd::core::BlindFactor::BlindFactor(&local_8a8,&local_8c8);
  cfd::core::BlindFactor::operator=(&local_110,&local_8a8);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x2ccb64);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_918,
             "085e6338f9da8a7f754b8e2726894e04bee997c8ada526f3215de8bc151aa063d3",&local_919);
  cfd::core::ConfidentialValue::ConfidentialValue(&local_8f8,&local_918);
  cfd::core::ConfidentialValue::operator=(local_f0,&local_8f8);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x2ccbec);
  std::__cxx11::string::~string((string *)&local_918);
  std::allocator<char>::~allocator((allocator<char> *)&local_919);
  cfd::api::ElementsUtxoAndOption::ElementsUtxoAndOption(in_stack_ffffffffffffdf90);
  cfd::UtxoData::operator=(&in_stack_ffffffffffffdf80->utxo,in_stack_ffffffffffffdf78);
  local_1430 = (undefined1 **)local_1428;
  cfd::api::ElementsUtxoAndOption::ElementsUtxoAndOption
            ((ElementsUtxoAndOption *)CONCAT44(in_stack_ffffffffffffdfa4,in_stack_ffffffffffffdfa0),
             in_stack_ffffffffffffdf98);
  local_eb8 = (undefined1 **)local_1428;
  local_eb0 = 1;
  std::allocator<cfd::api::ElementsUtxoAndOption>::allocator
            ((allocator<cfd::api::ElementsUtxoAndOption> *)0x2ccc7c);
  __l._M_array._4_4_ = in_stack_ffffffffffffdfbc;
  __l._M_array._0_4_ = in_stack_ffffffffffffdfb8;
  __l._M_len = (size_type)in_stack_ffffffffffffdfc0;
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
          *)CONCAT44(in_stack_ffffffffffffdfb4,in_stack_ffffffffffffdfb0),__l,
         (allocator_type *)in_stack_ffffffffffffdfa8);
  std::allocator<cfd::api::ElementsUtxoAndOption>::~allocator
            ((allocator<cfd::api::ElementsUtxoAndOption> *)0x2cccb0);
  local_1f00 = &local_eb8;
  do {
    local_1f00 = local_1f00 + -0xae;
    cfd::api::ElementsUtxoAndOption::~ElementsUtxoAndOption(in_stack_ffffffffffffdf80);
  } while (local_1f00 != local_1428);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)
             CONCAT44(in_stack_ffffffffffffdfb4,in_stack_ffffffffffffdfb0),in_stack_ffffffffffffdfa8
            );
  annex = local_1a60;
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffe000,in_stack_ffffffffffffdff8);
  local_1538.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_1a60;
  local_1538.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x1;
  std::allocator<cfd::UtxoData>::allocator((allocator<cfd::UtxoData> *)0x2ccd6e);
  __l_00._M_array._4_4_ = in_stack_ffffffffffffdfbc;
  __l_00._M_array._0_4_ = in_stack_ffffffffffffdfb8;
  __l_00._M_len = (size_type)in_stack_ffffffffffffdfc0;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
             CONCAT44(in_stack_ffffffffffffdfb4,in_stack_ffffffffffffdfb0),__l_00,
             (allocator_type *)in_stack_ffffffffffffdfa8);
  std::allocator<cfd::UtxoData>::~allocator((allocator<cfd::UtxoData> *)0x2ccda2);
  local_1f20 = &local_1538;
  do {
    local_1f20 = local_1f20 + -0x37;
    cfd::UtxoData::~UtxoData(&in_stack_ffffffffffffdf80->utxo);
    iVar13 = (int)in_stack_ffffffffffffe038;
    uVar9 = (undefined4)((ulong)in_stack_ffffffffffffdf78 >> 0x20);
  } while (local_1f20 != local_1a60);
  bVar1 = testing::internal::AlwaysTrue();
  uVar10 = (uint)((ulong)in_stack_ffffffffffffdf80 >> 0x20);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::CollectInputUtxo
                (in_stack_ffffffffffffe660,in_stack_ffffffffffffe658);
    }
  }
  else {
    testing::Message::Message(&local_1a78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffe580,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0xec,
               "Expected: txc.CollectInputUtxo(utxos) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffe580,&local_1a78)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffe580);
    testing::Message::~Message((Message *)0x2cd465);
  }
  outpoint = (OutPoint *)0x3fb999999999999a;
  pubkey = (Pubkey *)0x64;
  cfd::core::Amount::Amount((Amount *)&stack0xffffffffffffe560);
  cfd::core::Amount::Amount((Amount *)local_1ab0);
  cfd::core::Amount::Amount(&local_1ac0);
  cfd::api::ElementsTransactionApi::ElementsTransactionApi(&local_1ac1);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            (&local_1af8,&local_1510[0].super_AbstractTransaction);
  this_02 = (vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x0;
  uVar11 = 0x24;
  this_01 = (ElementsUtxoAndOption *)((ulong)uVar10 << 0x20);
  this_00 = (ConfidentialTxOutReference *)CONCAT44(uVar9,1);
  pcVar6 = local_1ab0;
  AVar8 = cfd::api::ElementsTransactionApi::EstimateFee
                    ((ElementsTransactionApi *)in_stack_ffffffffffffdff8,
                     (string *)
                     CONCAT17(in_stack_ffffffffffffdff7,
                              CONCAT16(in_stack_ffffffffffffdff6,
                                       CONCAT15(in_stack_ffffffffffffdff5,
                                                CONCAT14(in_stack_ffffffffffffdff4,
                                                         in_stack_ffffffffffffdff0)))),
                     in_stack_ffffffffffffdfe8,in_stack_ffffffffffffdfe0,in_stack_ffffffffffffdfd8,
                     in_stack_ffffffffffffdfd0,(bool)in_stack_ffffffffffffdfcf,
                     (double)in_stack_ffffffffffffdfc0,iVar13,in_stack_ffffffffffffe040,
                     in_stack_ffffffffffffe048);
  local_1b08 = (ConfidentialTransactionContext *)AVar8.amount_;
  local_1b00 = AVar8.ignore_check_;
  local_1ad8 = local_1b08;
  local_1ad0 = local_1b00;
  this_03 = local_1b08;
  bVar1 = (bool)local_1b00;
  std::__cxx11::string::~string((string *)&local_1af8);
  local_1b20 = cfd::core::Amount::GetSatoshiValue((Amount *)&stack0xffffffffffffe560);
  local_1b24 = 99;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((char *)in_stack_ffffffffffffdf98,(char *)this_02,
             (long *)CONCAT44(in_stack_ffffffffffffdf8c,uVar11),(int *)this_01);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1b18);
  if (!bVar2) {
    testing::Message::Message(&local_1b30);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x2cd6d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0xf7,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1b38,&local_1b30);
    testing::internal::AssertHelper::~AssertHelper(&local_1b38);
    testing::Message::~Message((Message *)0x2cd73b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2cd793);
  local_1b50 = cfd::core::Amount::GetSatoshiValue(&local_1ac0);
  local_1b54 = 0x5c;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((char *)in_stack_ffffffffffffdf98,(char *)this_02,
             (long *)CONCAT44(in_stack_ffffffffffffdf8c,uVar11),(int *)this_01);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1b48);
  if (!bVar2) {
    testing::Message::Message(&local_1b60);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x2cd861);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0xf8,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1b68,&local_1b60);
    testing::internal::AssertHelper::~AssertHelper(&local_1b68);
    testing::Message::~Message((Message *)0x2cd8c4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2cd91c);
  local_1b80 = cfd::core::Amount::GetSatoshiValue((Amount *)local_1ab0);
  local_1b84 = 7;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((char *)in_stack_ffffffffffffdf98,(char *)this_02,
             (long *)CONCAT44(in_stack_ffffffffffffdf8c,uVar11),(int *)this_01);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1b78);
  if (!bVar2) {
    testing::Message::Message(&local_1b90);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x2cd9ea);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0xf9,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1b98,&local_1b90);
    testing::internal::AssertHelper::~AssertHelper(&local_1b98);
    testing::Message::~Message((Message *)0x2cda4d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2cdaa2);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::vector((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
            *)0x2cdaaf);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      pcVar6 = (char *)0x0;
      cfd::ConfidentialTransactionContext::Blind
                ((ConfidentialTransactionContext *)
                 CONCAT17(in_stack_ffffffffffffdff7,
                          CONCAT16(in_stack_ffffffffffffdff6,
                                   CONCAT15(in_stack_ffffffffffffdff5,
                                            CONCAT14(in_stack_ffffffffffffdff4,
                                                     in_stack_ffffffffffffdff0)))),
                 (vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
                  *)in_stack_ffffffffffffdfe8,(int64_t)in_stack_ffffffffffffdfe0,
                 (int)((ulong)in_stack_ffffffffffffdfd8 >> 0x20),(int)in_stack_ffffffffffffdfd8,
                 (vector<cfd::core::BlindData,_std::allocator<cfd::core::BlindData>_> *)
                 in_stack_ffffffffffffdfd0);
    }
  }
  else {
    testing::Message::Message(local_1bb8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1bc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0xfc,
               "Expected: txc.Blind(&ct_addrs, 1, 0, 36) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1bc0,local_1bb8);
    testing::internal::AssertHelper::~AssertHelper(&local_1bc0);
    testing::Message::~Message((Message *)0x2cdbe4);
  }
  cfd::core::ConfidentialTransaction::GetTxOutList(&local_1bd8,local_1510);
  local_1bf0 = std::
               vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
               ::size(&local_1bd8);
  local_1bf4 = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((char *)in_stack_ffffffffffffdf98,(char *)this_02,
             (unsigned_long *)CONCAT44(in_stack_ffffffffffffdf8c,uVar11),(int *)this_01);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1be8);
  if (!bVar2) {
    testing::Message::Message(&local_1c00);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x2cdd09);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0xfe,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1c08,&local_1c00);
    testing::internal::AssertHelper::~AssertHelper(&local_1c08);
    testing::Message::~Message((Message *)0x2cdd6c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2cddc4);
  sVar5 = std::
          vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
          ::size(&local_1bd8);
  if (sVar5 == 2) {
    std::
    vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
    ::operator[](&local_1bd8,0);
    cfd::core::ConfidentialTxOutReference::GetConfidentialValue(this_00);
    local_1c19 = cfd::core::ConfidentialValue::HasBlinding(&local_1c48);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)this_01,(bool *)this_00,(type *)0x2cde3d);
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x2cde4c);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1c18);
    if (!bVar2) {
      testing::Message::Message(&local_1c50);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_1c78,(internal *)&local_1c18,
                 (AssertionResult *)"txouts[0].GetConfidentialValue().HasBlinding()","false","true",
                 pcVar6);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1c58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x100,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1c58,&local_1c50);
      testing::internal::AssertHelper::~AssertHelper(&local_1c58);
      std::__cxx11::string::~string((string *)&local_1c78);
      testing::Message::~Message((Message *)0x2cdf6e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2cdfe9);
    std::
    vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
    ::operator[](&local_1bd8,1);
    cfd::core::ConfidentialTxOutReference::GetConfidentialValue(this_00);
    bVar2 = cfd::core::ConfidentialValue::HasBlinding(&local_1cb8);
    local_1c89 = ~bVar2 & 1;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)this_01,(bool *)this_00,(type *)0x2ce04e);
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x2ce05d);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1c88);
    if (!bVar2) {
      testing::Message::Message(&local_1cc0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_1ce8,(internal *)&local_1c88,
                 (AssertionResult *)"txouts[1].GetConfidentialValue().HasBlinding()","true","false",
                 pcVar6);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1cc8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x101,pcVar6);
      testing::internal::AssertHelper::operator=(&local_1cc8,&local_1cc0);
      testing::internal::AssertHelper::~AssertHelper(&local_1cc8);
      std::__cxx11::string::~string((string *)&local_1ce8);
      testing::Message::~Message((Message *)0x2ce17f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2ce1f7);
  }
  cfd::core::ByteData::ByteData(&local_1d00);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::OutPoint::OutPoint(&local_1d28,&local_568,local_548);
      paVar12 = &local_1d61;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1d60,
                 "03f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d6",paVar12);
      cfd::core::Pubkey::Pubkey(&local_1d40,&local_1d60);
      paVar12 = &local_1da9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1da8,"cU4KjNUT7GjHm7CkjRjG46SzLrXHXoH3ekXmqa2jTCFPMkQ64sw1",
                 paVar12);
      cfd::core::Privkey::FromWif(&local_1d88,&local_1da8,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_1db8);
      this_01 = (ElementsUtxoAndOption *)0x0;
      cfd::ConfidentialTransactionContext::SignWithKey
                ((ConfidentialTransactionContext *)in_stack_ffffffffffffe580.data_,outpoint,pubkey,
                 (Privkey *)CONCAT71(in_stack_ffffffffffffe569,bVar1),(SigHashType *)this_03,
                 (bool)in_stack_ffffffffffffe55f,in_stack_ffffffffffffe590,annex);
      cfd::core::Privkey::~Privkey((Privkey *)0x2ce372);
      std::__cxx11::string::~string((string *)&local_1da8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1da9);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x2ce399);
      std::__cxx11::string::~string((string *)&local_1d60);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d61);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2ce3c0);
    }
    iVar13 = (int)pubkey;
  }
  else {
    testing::Message::Message(&local_1dc0);
    iVar13 = (int)pubkey;
    testing::internal::AssertHelper::AssertHelper
              (&local_1dc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x109,
               "Expected: txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout), Pubkey(\"03f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d6\"), Privkey::FromWif( \"cU4KjNUT7GjHm7CkjRjG46SzLrXHXoH3ekXmqa2jTCFPMkQ64sw1\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1dc8,&local_1dc0);
    testing::internal::AssertHelper::~AssertHelper(&local_1dc8);
    testing::Message::~Message((Message *)0x2ce552);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_1df0,&local_568,local_548);
      cfd::ConfidentialTransactionContext::Verify
                (this_03,(OutPoint *)CONCAT17(in_stack_ffffffffffffe55f,in_stack_ffffffffffffe558));
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2ce60f);
    }
  }
  else {
    testing::Message::Message(&local_1df8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x10a,
               "Expected: txc.Verify(OutPoint(utxo1.txid, utxo1.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1e00,&local_1df8);
    testing::internal::AssertHelper::~AssertHelper(&local_1e00);
    testing::Message::~Message((Message *)0x2ce6d9);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::Finalize
                ((ConfidentialTransactionContext *)CONCAT44(in_stack_ffffffffffffdf8c,uVar11));
      cfd::core::ByteData::operator=(&local_1d00,&local_1e18);
      cfd::core::ByteData::~ByteData((ByteData *)0x2ce78f);
    }
  }
  else {
    testing::Message::Message(&local_1e20);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x10c,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_1e28,&local_1e20);
    testing::internal::AssertHelper::~AssertHelper(&local_1e28);
    testing::Message::~Message((Message *)0x2ce859);
  }
  sVar7 = cfd::core::ByteData::GetDataSize(&local_1d00);
  if (((sVar7 != 0xcdf) && (sVar7 = cfd::core::ByteData::GetDataSize(&local_1d00), sVar7 != 0xcde))
     && (sVar7 = cfd::core::ByteData::GetDataSize(&local_1d00), sVar7 != 0xce0)) {
    local_1e40 = cfd::core::ByteData::GetDataSize(&local_1d00);
    local_1e44 = 0;
    testing::internal::EqHelper<false>::Compare<unsigned_long,int>
              ((char *)in_stack_ffffffffffffdf98,(char *)this_02,
               (unsigned_long *)CONCAT44(in_stack_ffffffffffffdf8c,uVar11),(int *)this_01);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e38);
    if (!bVar1) {
      testing::Message::Message(&local_1e50);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x2ce9c3);
      testing::internal::AssertHelper::AssertHelper
                (&local_1e58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x10f,pcVar6);
      testing::internal::AssertHelper::operator=(&local_1e58,&local_1e50);
      testing::internal::AssertHelper::~AssertHelper(&local_1e58);
      testing::Message::~Message((Message *)0x2cea20);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2cea75);
  }
  uVar3 = cfd::core::ConfidentialTransaction::GetVsize(local_1510);
  if ((uVar3 != 0x3dc) &&
     (uVar3 = cfd::core::ConfidentialTransaction::GetVsize(local_1510), uVar3 != 0x3db)) {
    local_1e6c = cfd::core::ConfidentialTransaction::GetVsize(local_1510);
    local_1e70 = 0x3dc;
    testing::internal::EqHelper<false>::Compare<unsigned_int,int>
              ((char *)in_stack_ffffffffffffdf98,(char *)this_02,
               (uint *)CONCAT44(in_stack_ffffffffffffdf8c,uVar11),(int *)this_01);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e68);
    if (!bVar1) {
      testing::Message::Message(&local_1e78);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x2ceb7a);
      testing::internal::AssertHelper::AssertHelper
                (&local_1e80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x113,pcVar6);
      testing::internal::AssertHelper::operator=(&local_1e80,&local_1e78);
      testing::internal::AssertHelper::~AssertHelper(&local_1e80);
      testing::Message::~Message((Message *)0x2cebd7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2cec2c);
  }
  uVar3 = cfd::core::ConfidentialTransaction::GetVsize(local_1510);
  local_1e84 = (uVar3 * iVar13) / 1000;
  if ((local_1e84 != 0x62) && (local_1e84 != 0x61)) {
    local_1e9c = 0x62;
    testing::internal::EqHelper<false>::Compare<unsigned_int,int>
              ((char *)in_stack_ffffffffffffdf98,(char *)this_02,
               (uint *)CONCAT44(in_stack_ffffffffffffdf8c,uVar11),(int *)this_01);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e98);
    if (!bVar1) {
      testing::Message::Message(&local_1ea8);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x2ced1d);
      testing::internal::AssertHelper::AssertHelper
                (&local_1eb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x118,pcVar6);
      testing::internal::AssertHelper::operator=(&local_1eb0,&local_1ea8);
      testing::internal::AssertHelper::~AssertHelper(&local_1eb0);
      testing::Message::~Message((Message *)0x2ced7a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2cedcf);
  }
  cfd::core::ByteData::~ByteData((ByteData *)0x2cedf0);
  std::
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  ::~vector((vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
             *)this_02);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::~vector((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
             *)this_02);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(this_02);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)this_01);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  ~vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
           *)this_02);
  cfd::api::ElementsUtxoAndOption::~ElementsUtxoAndOption(this_01);
  cfd::UtxoData::~UtxoData(&this_01->utxo);
  std::__cxx11::string::~string(local_50);
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x2cee65);
  return;
}

Assistant:

TEST(ElementsTransactionApi, EstimateFee_MinimumValue)
{
  ElementsAddressFactory factory(NetType::kElementsRegtest);
  std::string tx_hex = "02000000000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0000000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000005f5e100036a2e218bb512a3e65c80b59fec57aee428b7512276bcfa366c154dd7262994c817a914363273e2f851bda01e24cda41ba748b8d1f54cfe870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000000c8000000000000";

  // Address1
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
  utxo1.vout = 0;
  utxo1.locking_script = Script("0014eb3c0d55b7098a4aef4a18ee1eebcb1ed924a82b");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddress("ert1qav7q64dhpx9y4m62rrhpa67trmvjf2ptxfddld");
  utxo1.descriptor = "wpkh(03f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d6)";
  utxo1.amount = Amount(int64_t{100000200});
  utxo1.address_type = AddressType::kP2wpkhAddress;
  utxo1.asset = ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
  utxo1.asset_blind_factor = BlindFactor("ebfecaae1665f32a3843ce65c42fb6e3f51136fa9d37274b810887923ae89339");
  utxo1.amount_blind_factor = BlindFactor("80af7bd339db43ad22c1fa9109eea6d617c8b87b91c4bde2b5fafcbb1902211a");
  utxo1.value_commitment = ConfidentialValue("085e6338f9da8a7f754b8e2726894e04bee997c8ada526f3215de8bc151aa063d3");
  ElementsUtxoAndOption eutxo1;
  eutxo1.utxo = utxo1;
  std::vector<cfd::api::ElementsUtxoAndOption> utxos_and_options{
      eutxo1
  };

  ConfidentialTransactionContext txc(tx_hex);

  std::vector<cfd::UtxoData> utxos{utxo1};
  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));

  // check estimateFee
  double effective_fee_rate = 0.1;
  uint64_t effective_fee_rate2 = 100;
  Amount calc_fee;
  Amount utxo_fee;
  Amount tx_fee;
  ElementsTransactionApi api;
  calc_fee = api.EstimateFee(txc.GetHex(), utxos_and_options, utxo1.asset,
      &tx_fee, &utxo_fee, true, effective_fee_rate, 0, 36);
  EXPECT_EQ(calc_fee.GetSatoshiValue(), 99);
  EXPECT_EQ(tx_fee.GetSatoshiValue(), 92);
  EXPECT_EQ(utxo_fee.GetSatoshiValue(), 7);

  std::vector<cfd::core::ElementsConfidentialAddress> ct_addrs;
  EXPECT_NO_THROW(txc.Blind(&ct_addrs, 1, 0, 36));
  std::vector<ConfidentialTxOutReference> txouts = txc.GetTxOutList();
  EXPECT_EQ(txouts.size(), 2);
  if (txouts.size() == 2) {
    EXPECT_TRUE(txouts[0].GetConfidentialValue().HasBlinding());
    EXPECT_FALSE(txouts[1].GetConfidentialValue().HasBlinding());
  }

  ByteData tx;

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout),
      Pubkey("03f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d6"),
      Privkey::FromWif(
          "cU4KjNUT7GjHm7CkjRjG46SzLrXHXoH3ekXmqa2jTCFPMkQ64sw1", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo1.txid, utxo1.vout)));

  EXPECT_NO_THROW(tx = txc.Finalize());

  if ((tx.GetDataSize() != 3295) && (tx.GetDataSize() != 3294) && (tx.GetDataSize() != 3296)) {
    EXPECT_EQ(tx.GetDataSize(), 0);
  }

  if ((txc.GetVsize() != 988) && (txc.GetVsize() != 987)) {
    EXPECT_EQ(txc.GetVsize(), 988);
  }

  uint32_t minimum_fee = txc.GetVsize() * static_cast<uint32_t>(effective_fee_rate2) / 1000;
  if ((minimum_fee != 98) && (minimum_fee != 97)) {
    EXPECT_EQ(minimum_fee, 98);
  }
  // EXPECT_STREQ(tx.GetHex().c_str(), "");
}